

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

archive_entry * archive_entry_clear(archive_entry *entry)

{
  archive_entry *paVar1;
  
  if (entry != (archive_entry *)0x0) {
    archive_mstring_clean(&entry->ae_fflags_text);
    archive_mstring_clean(&entry->ae_gname);
    archive_mstring_clean(&entry->ae_hardlink);
    archive_mstring_clean(&entry->ae_pathname);
    archive_mstring_clean(&entry->ae_sourcepath);
    archive_mstring_clean(&entry->ae_symlink);
    archive_mstring_clean(&entry->ae_uname);
    free(entry->mac_metadata);
    entry->mac_metadata = (void *)0x0;
    entry->mac_metadata_size = 0;
    archive_acl_clear(&entry->acl);
    archive_entry_xattr_clear(entry);
    archive_entry_sparse_clear(entry);
    free(entry->stat);
    paVar1 = (archive_entry *)memset(entry,0,0x438);
    return paVar1;
  }
  return (archive_entry *)0x0;
}

Assistant:

struct archive_entry *
archive_entry_clear(struct archive_entry *entry)
{
	if (entry == NULL)
		return (NULL);
	archive_mstring_clean(&entry->ae_fflags_text);
	archive_mstring_clean(&entry->ae_gname);
	archive_mstring_clean(&entry->ae_hardlink);
	archive_mstring_clean(&entry->ae_pathname);
	archive_mstring_clean(&entry->ae_sourcepath);
	archive_mstring_clean(&entry->ae_symlink);
	archive_mstring_clean(&entry->ae_uname);
	archive_entry_copy_mac_metadata(entry, NULL, 0);
	archive_acl_clear(&entry->acl);
	archive_entry_xattr_clear(entry);
	archive_entry_sparse_clear(entry);
	free(entry->stat);
	memset(entry, 0, sizeof(*entry));
	return entry;
}